

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkAttachmentDescription * __thiscall
Fossilize::StateRecorder::Impl::copy<VkAttachmentDescription>
          (Impl *this,VkAttachmentDescription *src,size_t count,ScratchAllocator *alloc)

{
  VkAttachmentDescription *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkAttachmentDescription>(alloc,count);
    if (pVVar1 != (VkAttachmentDescription *)0x0) {
      pVVar1 = (VkAttachmentDescription *)memmove(pVVar1,src,count * 0x24);
      return pVVar1;
    }
  }
  return (VkAttachmentDescription *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}